

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

void tdefl_start_dynamic_block(tdefl_compressor *d)

{
  byte bVar1;
  mz_uint8 *pmVar2;
  char cVar3;
  short sVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int local_2fc;
  mz_uint len_6;
  mz_uint bits_6;
  mz_uint len_5;
  mz_uint bits_5;
  mz_uint code;
  mz_uint len_4;
  mz_uint bits_4;
  mz_uint len_3;
  mz_uint bits_3;
  mz_uint len_2;
  mz_uint bits_2;
  mz_uint len_1;
  mz_uint bits_1;
  mz_uint len;
  mz_uint bits;
  mz_uint8 code_size;
  mz_uint8 prev_code_size;
  mz_uint8 packed_code_sizes [320];
  mz_uint8 code_sizes_to_pack [320];
  uint local_30;
  mz_uint packed_code_sizes_index;
  mz_uint rle_repeat_count;
  mz_uint rle_z_count;
  mz_uint num_packed_code_sizes;
  mz_uint total_code_sizes_to_pack;
  mz_uint i;
  int num_bit_lengths;
  int num_dist_codes;
  int num_lit_codes;
  tdefl_compressor *d_local;
  
  len._3_1_ = 0xff;
  d->m_huff_count[0][0x100] = 1;
  tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
  tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
  num_bit_lengths = 0x11e;
  while ((0x101 < num_bit_lengths && (d->m_huff_code_sizes[0][num_bit_lengths + -1] == '\0'))) {
    num_bit_lengths = num_bit_lengths + -1;
  }
  i = 0x1e;
  while ((1 < (int)i && (d->m_huff_code_sizes[1][(int)(i - 1)] == '\0'))) {
    i = i - 1;
  }
  memcpy(packed_code_sizes + 0x138,d->m_huff_code_sizes,(long)num_bit_lengths);
  memcpy(packed_code_sizes + (long)num_bit_lengths + 0x138,d->m_huff_code_sizes + 1,(long)(int)i);
  rle_repeat_count = 0;
  packed_code_sizes_index = 0;
  local_30 = 0;
  memset(d->m_huff_count + 2,0,0x26);
  num_packed_code_sizes = 0;
  while( true ) {
    cVar3 = (char)packed_code_sizes_index;
    cVar5 = (char)local_30;
    sVar4 = (short)local_30;
    if (num_bit_lengths + i <= num_packed_code_sizes) break;
    bVar1 = packed_code_sizes[(ulong)num_packed_code_sizes + 0x138];
    if (bVar1 == 0) {
      if (local_30 != 0) {
        if (local_30 < 3) {
          d->m_huff_count[2][len._3_1_] = d->m_huff_count[2][len._3_1_] + sVar4;
          while (local_30 != 0) {
            *(byte *)((long)&bits + (ulong)rle_repeat_count) = len._3_1_;
            local_30 = local_30 - 1;
            rle_repeat_count = rle_repeat_count + 1;
          }
        }
        else {
          d->m_huff_count[2][0x10] = d->m_huff_count[2][0x10] + 1;
          uVar7 = rle_repeat_count + 1;
          *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x10;
          rle_repeat_count = rle_repeat_count + 2;
          *(char *)((long)&bits + (ulong)uVar7) = cVar5 + -3;
        }
        local_30 = 0;
      }
      packed_code_sizes_index = packed_code_sizes_index + 1;
      if (packed_code_sizes_index == 0x8a) {
        d->m_huff_count[2][0x12] = d->m_huff_count[2][0x12] + 1;
        *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x12;
        *(undefined1 *)((long)&bits + (ulong)(rle_repeat_count + 1)) = 0x7f;
        rle_repeat_count = rle_repeat_count + 2;
        packed_code_sizes_index = 0;
      }
    }
    else {
      if (packed_code_sizes_index != 0) {
        if (packed_code_sizes_index < 3) {
          d->m_huff_count[2][0] = d->m_huff_count[2][0] + (short)packed_code_sizes_index;
          while (packed_code_sizes_index != 0) {
            *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0;
            packed_code_sizes_index = packed_code_sizes_index - 1;
            rle_repeat_count = rle_repeat_count + 1;
          }
        }
        else {
          if (packed_code_sizes_index < 0xb) {
            d->m_huff_count[2][0x11] = d->m_huff_count[2][0x11] + 1;
            *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x11;
            *(char *)((long)&bits + (ulong)(rle_repeat_count + 1)) = cVar3 + -3;
          }
          else {
            d->m_huff_count[2][0x12] = d->m_huff_count[2][0x12] + 1;
            *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x12;
            *(char *)((long)&bits + (ulong)(rle_repeat_count + 1)) = cVar3 + -0xb;
          }
          rle_repeat_count = rle_repeat_count + 2;
        }
        packed_code_sizes_index = 0;
      }
      if (bVar1 == len._3_1_) {
        local_30 = local_30 + 1;
        if (local_30 == 6) {
          d->m_huff_count[2][0x10] = d->m_huff_count[2][0x10] + 1;
          uVar7 = rle_repeat_count + 1;
          *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x10;
          rle_repeat_count = rle_repeat_count + 2;
          *(undefined1 *)((long)&bits + (ulong)uVar7) = 3;
          local_30 = 0;
        }
      }
      else {
        if (local_30 != 0) {
          if (local_30 < 3) {
            d->m_huff_count[2][len._3_1_] = d->m_huff_count[2][len._3_1_] + sVar4;
            while (local_30 != 0) {
              *(byte *)((long)&bits + (ulong)rle_repeat_count) = len._3_1_;
              local_30 = local_30 - 1;
              rle_repeat_count = rle_repeat_count + 1;
            }
          }
          else {
            d->m_huff_count[2][0x10] = d->m_huff_count[2][0x10] + 1;
            uVar7 = rle_repeat_count + 1;
            *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x10;
            rle_repeat_count = rle_repeat_count + 2;
            *(char *)((long)&bits + (ulong)uVar7) = cVar5 + -3;
          }
          local_30 = 0;
        }
        d->m_huff_count[2][bVar1] = d->m_huff_count[2][bVar1] + 1;
        *(byte *)((long)&bits + (ulong)rle_repeat_count) = bVar1;
        rle_repeat_count = rle_repeat_count + 1;
      }
    }
    num_packed_code_sizes = num_packed_code_sizes + 1;
    len._3_1_ = bVar1;
  }
  if (local_30 == 0) {
    if (packed_code_sizes_index != 0) {
      if (packed_code_sizes_index < 3) {
        d->m_huff_count[2][0] = d->m_huff_count[2][0] + (short)packed_code_sizes_index;
        while (packed_code_sizes_index != 0) {
          *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0;
          packed_code_sizes_index = packed_code_sizes_index - 1;
          rle_repeat_count = rle_repeat_count + 1;
        }
      }
      else {
        if (packed_code_sizes_index < 0xb) {
          d->m_huff_count[2][0x11] = d->m_huff_count[2][0x11] + 1;
          *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x11;
          *(char *)((long)&bits + (ulong)(rle_repeat_count + 1)) = cVar3 + -3;
        }
        else {
          d->m_huff_count[2][0x12] = d->m_huff_count[2][0x12] + 1;
          *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x12;
          *(char *)((long)&bits + (ulong)(rle_repeat_count + 1)) = cVar3 + -0xb;
        }
        rle_repeat_count = rle_repeat_count + 2;
      }
    }
  }
  else if (local_30 != 0) {
    if (local_30 < 3) {
      d->m_huff_count[2][len._3_1_] = d->m_huff_count[2][len._3_1_] + sVar4;
      while (local_30 != 0) {
        *(byte *)((long)&bits + (ulong)rle_repeat_count) = len._3_1_;
        local_30 = local_30 - 1;
        rle_repeat_count = rle_repeat_count + 1;
      }
    }
    else {
      d->m_huff_count[2][0x10] = d->m_huff_count[2][0x10] + 1;
      uVar7 = rle_repeat_count + 1;
      *(undefined1 *)((long)&bits + (ulong)rle_repeat_count) = 0x10;
      rle_repeat_count = rle_repeat_count + 2;
      *(char *)((long)&bits + (ulong)uVar7) = cVar5 + -3;
    }
  }
  tdefl_optimize_huffman_table(d,2,0x13,7,0);
  d->m_bit_buffer = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
  d->m_bits_in = d->m_bits_in + 2;
  while (7 < d->m_bits_in) {
    if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
      pmVar2 = d->m_pOutput_buf;
      d->m_pOutput_buf = pmVar2 + 1;
      *pmVar2 = (mz_uint8)d->m_bit_buffer;
    }
    d->m_bit_buffer = d->m_bit_buffer >> 8;
    d->m_bits_in = d->m_bits_in - 8;
  }
  if (num_bit_lengths - 0x101U < 0x20) {
    d->m_bit_buffer = num_bit_lengths - 0x101U << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bits_in = d->m_bits_in + 5;
    while (7 < d->m_bits_in) {
      if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
        pmVar2 = d->m_pOutput_buf;
        d->m_pOutput_buf = pmVar2 + 1;
        *pmVar2 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      d->m_bits_in = d->m_bits_in - 8;
    }
    if (i - 1 < 0x20) {
      d->m_bit_buffer = i - 1 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = d->m_bits_in + 5;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar2 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar2 + 1;
          *pmVar2 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
      total_code_sizes_to_pack = 0x12;
      while ((-1 < (int)total_code_sizes_to_pack &&
             (d->m_huff_code_sizes[2]
              [s_tdefl_packed_code_size_syms_swizzle[(int)total_code_sizes_to_pack]] == '\0'))) {
        total_code_sizes_to_pack = total_code_sizes_to_pack - 1;
      }
      if ((int)(total_code_sizes_to_pack + 1) < 4) {
        local_2fc = 4;
      }
      else {
        local_2fc = total_code_sizes_to_pack + 1;
      }
      if (0xf < local_2fc - 4U) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                      ,0x3f8,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      d->m_bit_buffer = local_2fc - 4U << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = d->m_bits_in + 4;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar2 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar2 + 1;
          *pmVar2 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
      num_packed_code_sizes = 0;
      while( true ) {
        if (local_2fc <= (int)num_packed_code_sizes) {
          code_sizes_to_pack[0x13c] = '\0';
          code_sizes_to_pack[0x13d] = '\0';
          code_sizes_to_pack[0x13e] = '\0';
          code_sizes_to_pack[0x13f] = '\0';
          uVar7 = code_sizes_to_pack._316_4_;
          while( true ) {
            code_sizes_to_pack._316_4_ = uVar7;
            if (rle_repeat_count <= (uint)code_sizes_to_pack._316_4_) {
              return;
            }
            uVar6 = (uint)*(byte *)((long)&bits + (ulong)(uint)code_sizes_to_pack._316_4_);
            if (0x12 < uVar6) break;
            uVar7 = (uint)d->m_huff_codes[2][uVar6];
            bVar1 = d->m_huff_code_sizes[2][uVar6];
            if ((1 << (bVar1 & 0x1f)) - 1U < uVar7) {
              __assert_fail("bits <= ((1U << len) - 1U)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                            ,0x400,"void tdefl_start_dynamic_block(tdefl_compressor *)");
            }
            d->m_bit_buffer = uVar7 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
            d->m_bits_in = (uint)bVar1 + d->m_bits_in;
            while (7 < d->m_bits_in) {
              if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
                pmVar2 = d->m_pOutput_buf;
                d->m_pOutput_buf = pmVar2 + 1;
                *pmVar2 = (mz_uint8)d->m_bit_buffer;
              }
              d->m_bit_buffer = d->m_bit_buffer >> 8;
              d->m_bits_in = d->m_bits_in - 8;
            }
            uVar7 = code_sizes_to_pack._316_4_ + 1;
            if (0xf < uVar6) {
              uVar7 = (uint)*(byte *)((long)&bits + (ulong)(code_sizes_to_pack._316_4_ + 1));
              bVar1 = "\x02\x03\a"[uVar6 - 0x10];
              if ((1 << (bVar1 & 0x1f)) - 1U < uVar7) {
                __assert_fail("bits <= ((1U << len) - 1U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                              ,0x402,"void tdefl_start_dynamic_block(tdefl_compressor *)");
              }
              d->m_bit_buffer = uVar7 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
              d->m_bits_in = (int)(char)bVar1 + d->m_bits_in;
              while (uVar7 = code_sizes_to_pack._316_4_ + 2, 7 < d->m_bits_in) {
                if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
                  pmVar2 = d->m_pOutput_buf;
                  d->m_pOutput_buf = pmVar2 + 1;
                  *pmVar2 = (mz_uint8)d->m_bit_buffer;
                }
                d->m_bit_buffer = d->m_bit_buffer >> 8;
                d->m_bits_in = d->m_bits_in - 8;
              }
            }
          }
          __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                        ,0x3ff,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        uVar7 = (uint)d->m_huff_code_sizes[2]
                      [s_tdefl_packed_code_size_syms_swizzle[num_packed_code_sizes]];
        if (7 < uVar7) break;
        d->m_bit_buffer = uVar7 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
        d->m_bits_in = d->m_bits_in + 3;
        while (7 < d->m_bits_in) {
          if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
            pmVar2 = d->m_pOutput_buf;
            d->m_pOutput_buf = pmVar2 + 1;
            *pmVar2 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          d->m_bits_in = d->m_bits_in - 8;
        }
        num_packed_code_sizes = num_packed_code_sizes + 1;
      }
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                    ,0x3fa,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    __assert_fail("bits <= ((1U << len) - 1U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                  ,0x3f2,"void tdefl_start_dynamic_block(tdefl_compressor *)");
  }
  __assert_fail("bits <= ((1U << len) - 1U)",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                ,0x3f1,"void tdefl_start_dynamic_block(tdefl_compressor *)");
}

Assistant:

static void tdefl_start_dynamic_block(tdefl_compressor *d)
{
    int num_lit_codes, num_dist_codes, num_bit_lengths;
    mz_uint i, total_code_sizes_to_pack, num_packed_code_sizes, rle_z_count, rle_repeat_count, packed_code_sizes_index;
    mz_uint8 code_sizes_to_pack[TDEFL_MAX_HUFF_SYMBOLS_0 + TDEFL_MAX_HUFF_SYMBOLS_1], packed_code_sizes[TDEFL_MAX_HUFF_SYMBOLS_0 + TDEFL_MAX_HUFF_SYMBOLS_1], prev_code_size = 0xFF;

    d->m_huff_count[0][256] = 1;

    tdefl_optimize_huffman_table(d, 0, TDEFL_MAX_HUFF_SYMBOLS_0, 15, MZ_FALSE);
    tdefl_optimize_huffman_table(d, 1, TDEFL_MAX_HUFF_SYMBOLS_1, 15, MZ_FALSE);

    for (num_lit_codes = 286; num_lit_codes > 257; num_lit_codes--)
        if (d->m_huff_code_sizes[0][num_lit_codes - 1])
            break;
    for (num_dist_codes = 30; num_dist_codes > 1; num_dist_codes--)
        if (d->m_huff_code_sizes[1][num_dist_codes - 1])
            break;

    memcpy(code_sizes_to_pack, &d->m_huff_code_sizes[0][0], num_lit_codes);
    memcpy(code_sizes_to_pack + num_lit_codes, &d->m_huff_code_sizes[1][0], num_dist_codes);
    total_code_sizes_to_pack = num_lit_codes + num_dist_codes;
    num_packed_code_sizes = 0;
    rle_z_count = 0;
    rle_repeat_count = 0;

    memset(&d->m_huff_count[2][0], 0, sizeof(d->m_huff_count[2][0]) * TDEFL_MAX_HUFF_SYMBOLS_2);
    for (i = 0; i < total_code_sizes_to_pack; i++)
    {
        mz_uint8 code_size = code_sizes_to_pack[i];
        if (!code_size)
        {
            TDEFL_RLE_PREV_CODE_SIZE();
            if (++rle_z_count == 138)
            {
                TDEFL_RLE_ZERO_CODE_SIZE();
            }
        }
        else
        {
            TDEFL_RLE_ZERO_CODE_SIZE();
            if (code_size != prev_code_size)
            {
                TDEFL_RLE_PREV_CODE_SIZE();
                d->m_huff_count[2][code_size] = (mz_uint16)(d->m_huff_count[2][code_size] + 1);
                packed_code_sizes[num_packed_code_sizes++] = code_size;
            }
            else if (++rle_repeat_count == 6)
            {
                TDEFL_RLE_PREV_CODE_SIZE();
            }
        }
        prev_code_size = code_size;
    }
    if (rle_repeat_count)
    {
        TDEFL_RLE_PREV_CODE_SIZE();
    }
    else
    {
        TDEFL_RLE_ZERO_CODE_SIZE();
    }

    tdefl_optimize_huffman_table(d, 2, TDEFL_MAX_HUFF_SYMBOLS_2, 7, MZ_FALSE);

    TDEFL_PUT_BITS(2, 2);

    TDEFL_PUT_BITS(num_lit_codes - 257, 5);
    TDEFL_PUT_BITS(num_dist_codes - 1, 5);

    for (num_bit_lengths = 18; num_bit_lengths >= 0; num_bit_lengths--)
        if (d->m_huff_code_sizes[2][s_tdefl_packed_code_size_syms_swizzle[num_bit_lengths]])
            break;
    num_bit_lengths = MZ_MAX(4, (num_bit_lengths + 1));
    TDEFL_PUT_BITS(num_bit_lengths - 4, 4);
    for (i = 0; (int)i < num_bit_lengths; i++)
        TDEFL_PUT_BITS(d->m_huff_code_sizes[2][s_tdefl_packed_code_size_syms_swizzle[i]], 3);

    for (packed_code_sizes_index = 0; packed_code_sizes_index < num_packed_code_sizes;)
    {
        mz_uint code = packed_code_sizes[packed_code_sizes_index++];
        MZ_ASSERT(code < TDEFL_MAX_HUFF_SYMBOLS_2);
        TDEFL_PUT_BITS(d->m_huff_codes[2][code], d->m_huff_code_sizes[2][code]);
        if (code >= 16)
            TDEFL_PUT_BITS(packed_code_sizes[packed_code_sizes_index++], "\02\03\07"[code - 16]);
    }
}